

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void print_m2v(FILE *out,char *indent,m2v *M)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (0 < *(int *)indent) {
    iVar4 = 0;
    do {
      pcVar1 = " ";
      if (iVar4 == 0) {
        pcVar1 = "[";
      }
      fprintf((FILE *)out,"%s%s","  ",pcVar1);
      if (0 < *(int *)(indent + 4)) {
        uVar3 = 0;
        do {
          fprintf((FILE *)out,"%d",
                  (ulong)((*(uint *)(*(long *)(indent + 0x10) +
                                    (long)((int)(uVar3 >> 5) + *(int *)(indent + 8) * iVar4) * 4) >>
                           ((uint)uVar3 & 0x1f) & 1) != 0));
          uVar2 = (uint)uVar3 + 1;
          uVar3 = (ulong)uVar2;
        } while ((int)uVar2 < *(int *)(indent + 4));
      }
      pcVar1 = "";
      if (iVar4 == *(int *)indent + -1) {
        pcVar1 = " ]";
      }
      fprintf((FILE *)out,"%s\n",pcVar1);
      iVar4 = iVar4 + 1;
    } while (iVar4 < *(int *)indent);
  }
  return;
}

Assistant:

UNUSED
static void print_m2v(FILE* out, const char* indent, const m2v* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		fprintf(out, "%s%s", indent, (r == 0 ? "[" : " "));
		for (int c = 0; c < M->n_col; ++c) {
			fprintf(out, "%d", (int)m2v_get_el(M, r, c));
		}
		fprintf(out, "%s\n", ((r == M->n_row - 1) ? " ]" : ""));
	}
}